

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O1

bool __thiscall
ON_ArithmeticCalculatorImplementation::DecreaseExpressionDepth
          (ON_ArithmeticCalculatorImplementation *this)

{
  uint uVar1;
  bool bVar2;
  ARITHMETIC_OP AVar3;
  uint uVar4;
  
  if (this->m_error_condition != '\0') {
    return false;
  }
  if (this->m_expression_depth < 2) {
    this->m_op_stack_pointer = 0;
    this->m_expression_depth = 0;
    this->m_op_stack[0].m_x = 0.0;
    this->m_op_stack[0].m_op = op_unset;
    this->m_op_stack[0].m_level = 0;
  }
  else {
    if (this->m_expression_depth == this->m_op_stack[this->m_op_stack_pointer].m_level) {
      this->m_bPendingImpliedMultiplication = '\0';
      AVar3 = ArithmeticOperationIsPending(this);
      if (AVar3 - op_add < 2) {
        bVar2 = EvaluatePendingArithmeticOperation(this);
        if (!bVar2) {
          return false;
        }
LAB_0041e3ff:
        uVar1 = this->m_op_stack_pointer;
        if ((this->m_expression_depth == this->m_op_stack[uVar1].m_level) &&
           (this->m_op_stack[uVar1].m_op == op_number)) {
          uVar4 = this->m_expression_depth - 1;
          this->m_expression_depth = uVar4;
          this->m_op_stack[uVar1].m_level = uVar4;
          AVar3 = ArithmeticOperationIsPending(this);
          if (((AVar3 & ~op_number) == op_mult) &&
             (bVar2 = EvaluatePendingArithmeticOperation(this), !bVar2)) {
            return false;
          }
          this->m_bPendingImpliedMultiplication = this->m_bImpliedMultiplicationEnabled;
          return true;
        }
        if (this->m_error_condition != '\0') {
          return false;
        }
      }
      else if (AVar3 == op_unset) goto LAB_0041e3ff;
      this->m_op_stack_pointer = 0;
      this->m_expression_depth = 0;
      this->m_op_stack[0].m_x = 0.0;
      this->m_op_stack[0].m_op = op_unset;
      this->m_op_stack[0].m_level = 0;
      this->m_error_condition = '\0';
      this->m_bPendingImpliedMultiplication = '\0';
      this->m_bPendingUnaryPlus = '\0';
      this->m_bPendingUnaryMinus = '\0';
      this->m_bUnsetValue = '\0';
      goto LAB_0041e3ef;
    }
    this->m_op_stack_pointer = 0;
    this->m_expression_depth = 0;
    this->m_op_stack[0].m_x = 0.0;
    this->m_op_stack[0].m_op = op_unset;
    this->m_op_stack[0].m_level = 0;
  }
  this->m_bPendingImpliedMultiplication = '\0';
  this->m_bPendingUnaryPlus = '\0';
  this->m_bPendingUnaryMinus = '\0';
  this->m_bUnsetValue = '\0';
LAB_0041e3ef:
  this->m_error_condition = '\x02';
  return false;
}

Assistant:

bool ON_ArithmeticCalculatorImplementation::DecreaseExpressionDepth()
{
  if (m_error_condition)
    return false;

  if ( m_expression_depth <= 1 )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;
  }

  if ( m_expression_depth != m_op_stack[m_op_stack_pointer].m_level )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  m_bPendingImpliedMultiplication = false;

  const unsigned int pending_op = ArithmeticOperationIsPending();
  switch(pending_op)
  {
  case ON_ArithmeticCalculatorImplementation::op_add:
  case ON_ArithmeticCalculatorImplementation::op_sub:
    if ( !EvaluatePendingArithmeticOperation() )
      return false;
    break;

  case ON_ArithmeticCalculatorImplementation::op_unset:
    // empty case
    break;

  default:
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;
    break;
  }

  if ( m_expression_depth != m_op_stack[m_op_stack_pointer].m_level )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  if ( ON_ArithmeticCalculatorImplementation::op_number != m_op_stack[m_op_stack_pointer].m_op )
  {
    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
    return false;    
  }

  m_expression_depth--;
  m_op_stack[m_op_stack_pointer].m_level = m_expression_depth;

  const unsigned int previous_pending_op = ArithmeticOperationIsPending();
  switch(previous_pending_op)
  {
  case ON_ArithmeticCalculatorImplementation::op_mult:
  case ON_ArithmeticCalculatorImplementation::op_div:
    if ( !EvaluatePendingArithmeticOperation() )
      return false;
    break;
  }

  m_bPendingImpliedMultiplication = m_bImpliedMultiplicationEnabled;

  return true;
}